

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O2

CURLcode req_flush(Curl_easy *data)

{
  bufq *q;
  size_t *psVar1;
  _Bool _Var2;
  CURLcode CVar3;
  uint uVar4;
  CURLcode CVar5;
  ulong hds_len;
  size_t blen;
  uchar *buf;
  size_t local_38;
  
  CVar3 = CURLE_FAILED_INIT;
  if ((data != (Curl_easy *)0x0) && (data->conn != (connectdata *)0x0)) {
    q = &(data->req).sendbuf;
    _Var2 = Curl_bufq_is_empty(q);
    if (_Var2) {
      _Var2 = Curl_xfer_needs_flush(data);
      if (_Var2) {
        CVar3 = Curl_xfer_flush(data);
        return CVar3;
      }
    }
    else {
      do {
        _Var2 = Curl_bufq_peek(q,&buf,&blen);
        if (!_Var2) break;
        hds_len = (data->req).sendbuf_hds_len;
        if (blen <= hds_len) {
          hds_len = blen;
        }
        CVar3 = xfer_send(data,(char *)CONCAT71(buf._1_7_,(byte)buf),blen,hds_len,&local_38);
        if (CVar3 != CURLE_OK) {
          return CVar3;
        }
        Curl_bufq_skip(q,local_38);
        if (hds_len != 0) {
          if (local_38 <= hds_len) {
            hds_len = local_38;
          }
          psVar1 = &(data->req).sendbuf_hds_len;
          *psVar1 = *psVar1 - hds_len;
        }
      } while (blen <= local_38);
      _Var2 = Curl_bufq_is_empty(q);
      if (!_Var2) {
        return CURLE_AGAIN;
      }
    }
    uVar4 = *(uint *)&(data->req).field_0xd9;
    if ((uVar4 & 0x60) == 0x20) {
      CVar3 = xfer_send(data,(char *)&blen,0,0,(size_t *)&buf);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      uVar4 = *(uint *)&(data->req).field_0xd9;
    }
    CVar3 = CURLE_OK;
    if ((uVar4 & 0x160) == 0x60) {
      if ((uVar4 >> 0x14 & 1) != 0) {
        CVar5 = Curl_xfer_send_shutdown(data,(_Bool *)&buf);
        CVar3 = CURLE_AGAIN;
        if (((byte)buf & 1) != 0) {
          CVar3 = CURLE_OK;
        }
        if (CVar5 != CURLE_OK) {
          CVar3 = CVar5;
        }
        if ((CVar5 == CURLE_OK & (byte)buf) != 1) {
          return CVar3;
        }
      }
      CVar3 = Curl_req_set_upload_done(data);
    }
  }
  return CVar3;
}

Assistant:

static CURLcode req_flush(struct Curl_easy *data)
{
  CURLcode result;

  if(!data || !data->conn)
    return CURLE_FAILED_INIT;

  if(!Curl_bufq_is_empty(&data->req.sendbuf)) {
    result = req_send_buffer_flush(data);
    if(result)
      return result;
    if(!Curl_bufq_is_empty(&data->req.sendbuf)) {
      DEBUGF(infof(data, "Curl_req_flush(len=%zu) -> EAGAIN",
             Curl_bufq_len(&data->req.sendbuf)));
      return CURLE_AGAIN;
    }
  }
  else if(Curl_xfer_needs_flush(data)) {
    DEBUGF(infof(data, "Curl_req_flush(), xfer send_pending"));
    return Curl_xfer_flush(data);
  }

  if(data->req.eos_read && !data->req.eos_sent) {
    char tmp;
    size_t nwritten;
    result = xfer_send(data, &tmp, 0, 0, &nwritten);
    if(result)
      return result;
    DEBUGASSERT(data->req.eos_sent);
  }

  if(!data->req.upload_done && data->req.eos_read && data->req.eos_sent) {
    DEBUGASSERT(Curl_bufq_is_empty(&data->req.sendbuf));
    if(data->req.shutdown) {
      bool done;
      result = Curl_xfer_send_shutdown(data, &done);
      if(result)
        return result;
      if(!done)
        return CURLE_AGAIN;
    }
    return Curl_req_set_upload_done(data);
  }
  return CURLE_OK;
}